

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginTabItem(char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  uint in_EDX;
  ImGuiTabItem *tab;
  bool ret;
  ImGuiTabBar *tab_bar;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiTabItemFlags in_stack_000000f4;
  bool *in_stack_000000f8;
  char *in_stack_00000100;
  ImGuiTabBar *in_stack_00000108;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  ImGuiID in_stack_ffffffffffffffb4;
  bool local_1;
  
  if ((GImGui->CurrentWindow->SkipItems & 1U) == 0) {
    if (GImGui->CurrentTabBar == (ImGuiTabBar *)0x0) {
      __assert_fail("(tab_bar) && \"BeginTabItem() Needs to be called between BeginTabBar() and EndTabBar()!\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                    ,0x1b86,"bool ImGui::BeginTabItem(const char *, bool *, ImGuiTabItemFlags)");
    }
    local_1 = TabItemEx(in_stack_00000108,in_stack_00000100,in_stack_000000f8,in_stack_000000f4);
    if ((local_1) && ((in_EDX & 8) == 0)) {
      ImVector<ImGuiTabItem>::operator[]
                ((ImVector<ImGuiTabItem> *)
                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac);
      PushOverrideID(in_stack_ffffffffffffffb4);
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool    ImGui::BeginTabItem(const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    ImGuiTabBar* tab_bar = g.CurrentTabBar;
    if (tab_bar == NULL)
    {
        IM_ASSERT_USER_ERROR(tab_bar, "BeginTabItem() Needs to be called between BeginTabBar() and EndTabBar()!");
        return false;
    }
    bool ret = TabItemEx(tab_bar, label, p_open, flags);
    if (ret && !(flags & ImGuiTabItemFlags_NoPushId))
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_bar->LastTabItemIdx];
        PushOverrideID(tab->ID); // We already hashed 'label' so push into the ID stack directly instead of doing another hash through PushID(label)
    }
    return ret;
}